

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotest.c
# Opt level: O2

int test_is_at(int index,...)

{
  char in_AL;
  uint uVar1;
  undefined8 in_RCX;
  int *piVar2;
  undefined8 in_RDX;
  int *piVar3;
  ulong uVar4;
  int *piVar5;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  void *in_XMM1_Qa;
  int local_b8 [2];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  va_list arg;
  
  local_b0 = in_RSI;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  if (in_AL != '\0') {
    uStack_88 = in_XMM0_Qa;
    arg[0].overflow_arg_area = in_XMM1_Qa;
  }
  piVar3 = (int *)&stack0x00000008;
  uVar1 = 8;
  piVar2 = test_index;
  while ((index != 0 && (index == *piVar2))) {
    if (uVar1 < 0x29) {
      uVar4 = (ulong)uVar1;
      uVar1 = uVar1 + 8;
      piVar5 = (int *)((long)local_b8 + uVar4);
    }
    else {
      piVar5 = piVar3;
      piVar3 = piVar3 + 2;
    }
    piVar2 = piVar2 + 1;
    index = *piVar5;
  }
  return (uint)(index == 0 && *piVar2 == 0);
}

Assistant:

int test_is_at(int index, ...)
{
    va_list arg;
    va_start(arg, index);
    size_t level;

    for (level = 0; index == test_index[level] && index != 0; ++level)
        index = va_arg(arg, int);

    va_end(arg);
    return index == test_index[level] && index == 0;
}